

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O1

void __thiscall Hpipe::Instruction::update_in_a_cycle(Instruction *this)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Vec<std::pair<Hpipe::Instruction_*,_unsigned_int>_> stack;
  long *local_58;
  long *plStack_50;
  long local_48;
  Instruction *local_38;
  int local_2c;
  
  cur_op_id = cur_op_id + 1;
  local_58 = (long *)0x0;
  plStack_50 = (long *)0x0;
  local_48 = 0;
  local_2c = 0;
  local_38 = this;
  std::
  vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
  ::emplace_back<Hpipe::Instruction*,int>
            ((vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
              *)&local_58,&local_38,&local_2c);
  do {
    lVar1 = plStack_50[-2];
    if (*(int *)(lVar1 + 0x16c) == cur_op_id) {
      plStack_50 = plStack_50 + -2;
      uVar5 = *(uint *)(lVar1 + 200);
      uVar4 = (ulong)(int)uVar5;
      if (-1 < (long)uVar4) {
        while (uVar4 < (ulong)((long)plStack_50 - (long)local_58 >> 4)) {
          uVar5 = uVar5 + 1;
          *(undefined1 *)(local_58[uVar4 * 2] + 0xcd) = 1;
          uVar4 = (ulong)uVar5;
        }
      }
    }
    else {
      *(int *)(lVar1 + 0x16c) = cur_op_id;
      *(int *)(lVar1 + 200) = (int)((ulong)((long)plStack_50 - (long)local_58) >> 4) + -1;
    }
    do {
      plVar3 = plStack_50 + -2;
      uVar4 = (ulong)*(uint *)(plStack_50 + -1);
      lVar1 = *plVar3;
      lVar2 = *(long *)(lVar1 + 0x98);
      uVar6 = (*(long *)(lVar1 + 0xa0) - lVar2 >> 3) * -0x3333333333333333;
      if (uVar4 <= uVar6 && uVar6 - uVar4 != 0) {
        *(uint *)(plStack_50 + -1) = *(uint *)(plStack_50 + -1) + 1;
        local_38 = (Instruction *)((ulong)local_38 & 0xffffffff00000000);
        std::
        vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
        ::emplace_back<Hpipe::Instruction*&,int>
                  ((vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
                    *)&local_58,(Instruction **)(lVar2 + uVar4 * 0x28),(int *)&local_38);
        break;
      }
      *(undefined4 *)(lVar1 + 200) = 0xffffffff;
      plStack_50 = plVar3;
    } while (plVar3 != local_58);
    if (uVar6 < uVar4 || uVar6 - uVar4 == 0) {
      if (local_58 != (long *)0x0) {
        operator_delete(local_58,local_48 - (long)local_58);
      }
      return;
    }
  } while( true );
}

Assistant:

void Instruction::update_in_a_cycle() {
    ++Instruction::cur_op_id;
    Vec<std::pair<Instruction *,unsigned>> stack;
    stack.emplace_back( this, 0 );
    while ( true ) {
        std::pair<Instruction *,unsigned> t = stack.back();

        // instruction
        if ( t.first->op_id == Instruction::cur_op_id ) {
            stack.pop_back();
            if ( t.first->num_in_dfs_stack >= 0 )
                for( unsigned j = t.first->num_in_dfs_stack; j < stack.size(); ++j )
                    stack[ j ].first->in_a_cycle = true;
        } else {
            t.first->op_id = Instruction::cur_op_id;
            t.first->num_in_dfs_stack = stack.size() - 1;
        }

        // next
        while ( stack.back().second >= stack.back().first->next.size() ) {
            stack.back().first->num_in_dfs_stack = - 1;
            stack.pop_back();
            if ( stack.empty() )
                return;
        }
        stack.emplace_back( stack.back().first->next[ stack.back().second++ ].inst, 0 );
    }
}